

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O3

void png_set_compression_buffer_size(png_structrp png_ptr,size_t size)

{
  char *warning_message;
  
  if (png_ptr != (png_structrp)0x0) {
    if (size - 0x80000000 < 0xffffffff80000001) {
      png_error(png_ptr,"invalid compression buffer size");
    }
    if ((png_ptr->mode & 0x8000) == 0) {
      if (png_ptr->zowner == 0) {
        if (5 < size) {
          if (png_ptr->zbuffer_size == size) {
            return;
          }
          png_free_buffer_list(png_ptr,&png_ptr->zbuffer_list);
          png_ptr->zbuffer_size = (uInt)size;
          return;
        }
        warning_message = "Compression buffer size cannot be reduced below 6";
      }
      else {
        warning_message = "Compression buffer size cannot be changed because it is in use";
      }
      png_warning(png_ptr,warning_message);
      return;
    }
    png_ptr->IDAT_read_size = (uInt)size;
  }
  return;
}

Assistant:

void PNGAPI
png_set_compression_buffer_size(png_structrp png_ptr, size_t size)
{
   if (png_ptr == NULL)
      return;

   if (size == 0 || size > PNG_UINT_31_MAX)
      png_error(png_ptr, "invalid compression buffer size");

#  ifdef PNG_SEQUENTIAL_READ_SUPPORTED
   if ((png_ptr->mode & PNG_IS_READ_STRUCT) != 0)
   {
      png_ptr->IDAT_read_size = (png_uint_32)size; /* checked above */
      return;
   }
#  endif

#  ifdef PNG_WRITE_SUPPORTED
   if ((png_ptr->mode & PNG_IS_READ_STRUCT) == 0)
   {
      if (png_ptr->zowner != 0)
      {
         png_warning(png_ptr,
             "Compression buffer size cannot be changed because it is in use");

         return;
      }

#ifndef __COVERITY__
      /* Some compilers complain that this is always false.  However, it
       * can be true when integer overflow happens.
       */
      if (size > ZLIB_IO_MAX)
      {
         png_warning(png_ptr,
             "Compression buffer size limited to system maximum");
         size = ZLIB_IO_MAX; /* must fit */
      }
#endif

      if (size < 6)
      {
         /* Deflate will potentially go into an infinite loop on a SYNC_FLUSH
          * if this is permitted.
          */
         png_warning(png_ptr,
             "Compression buffer size cannot be reduced below 6");

         return;
      }

      if (png_ptr->zbuffer_size != size)
      {
         png_free_buffer_list(png_ptr, &png_ptr->zbuffer_list);
         png_ptr->zbuffer_size = (uInt)size;
      }
   }
#  endif
}